

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O3

deUint32 __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferTest::drawAndSwap
          (MutableRenderBufferTest *this,Library *egl,deUint32 color,bool flush)

{
  deUint32 dVar1;
  deUint32 extraout_EAX;
  undefined7 in_register_00000009;
  float fVar2;
  
  fVar2 = (float)color / 255.0;
  (*(this->m_gl).clearColor)(fVar2,fVar2,fVar2,fVar2);
  (*(this->m_gl).clear)(0x4000);
  if ((int)CONCAT71(in_register_00000009,flush) != 0) {
    dVar1 = (*(this->m_gl).flush)();
    return dVar1;
  }
  (*egl->_vptr_Library[0x31])(egl,this->m_eglDisplay,this->m_eglSurface);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,"swapBuffers(m_eglDisplay, m_eglSurface)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                   ,0xd5);
  return extraout_EAX;
}

Assistant:

deUint32 MutableRenderBufferTest::drawAndSwap (const Library& egl, deUint32 color, bool flush)
{
	DE_ASSERT(color < 256);
	m_gl.clearColor((float)color/255.f, (float)color/255.f, (float)color/255.f, (float)color/255.f);
	m_gl.clear(GL_COLOR_BUFFER_BIT);
	if (flush)
	{
		m_gl.flush();
	}
	else
	{
		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));
	}
	return (color | color << 8 | color << 16 | color << 24);
}